

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5hl.c
# Opt level: O2

char * MD5FileChunk(char *filename,char *buf,off_t ofs,off_t len)

{
  byte bVar1;
  int __fd;
  int iVar2;
  __off_t _Var3;
  ssize_t sVar4;
  long lVar5;
  int *piVar6;
  size_t __nbytes;
  uint len_00;
  ulong uVar7;
  ulong uVar8;
  byte local_2138 [24];
  MD5_CTX ctx;
  stat stbuf;
  uchar buffer [8192];
  
  MD5Init(&ctx);
  __fd = open(filename,0);
  if ((-1 < __fd) && (iVar2 = fstat(__fd,(stat *)&stbuf), -1 < iVar2)) {
    if (stbuf.st_size < ofs) {
      ofs = stbuf.st_size;
    }
    _Var3 = lseek(__fd,ofs,0);
    if (-1 < _Var3) {
      uVar7 = stbuf.st_size - ofs;
      uVar8 = len;
      if ((long)uVar7 < len) {
        uVar8 = uVar7;
      }
      if (len == 0) {
        uVar8 = uVar7;
      }
      for (; 0 < (long)uVar8; uVar8 = uVar8 - (len_00 & 0x7fffffff)) {
        __nbytes = 0x2000;
        if (uVar8 < 0x2000) {
          __nbytes = uVar8;
        }
        sVar4 = read(__fd,buffer,__nbytes);
        len_00 = (uint)sVar4;
        if ((int)len_00 < 0) {
          piVar6 = __errno_location();
          iVar2 = *piVar6;
          close(__fd);
          *piVar6 = iVar2;
          return (char *)0x0;
        }
        MD5Update(&ctx,buffer,len_00);
      }
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      close(__fd);
      *piVar6 = iVar2;
      if ((buf != (char *)0x0) || (buf = (char *)malloc(0x21), buf != (char *)0x0)) {
        MD5Final(local_2138,&ctx);
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          bVar1 = local_2138[lVar5];
          buf[lVar5 * 2] = "0123456789abcdef"[bVar1 >> 4];
          buf[lVar5 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        }
        buf[0x20] = '\0';
        return buf;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *MD5FileChunk(const char *filename, char *buf, off_t ofs, off_t len)
{
  unsigned char buffer[BUFSIZ];
  MD5_CTX ctx;
  struct stat stbuf;
  int f, i, e;
  off_t n;

  MD5Init(&ctx);
#ifdef _WIN32
  f = _open(filename, O_RDONLY | O_BINARY);
#else
  f = open(filename, O_RDONLY);
#endif
  if (f < 0)
    return 0;
  if (fstat(f, &stbuf) < 0)
    return 0;
  if (ofs > stbuf.st_size)
    ofs = stbuf.st_size;
  if ((len == 0) || (len > stbuf.st_size - ofs))
    len = stbuf.st_size - ofs;
  if (lseek(f, ofs, SEEK_SET) < 0)
    return 0;
  n = len;
  i = 0;
  while (n > 0) {
    if (n > sizeof(buffer))
      i = read(f, buffer, sizeof(buffer));
    else
      i = read(f, buffer, n);
    if (i < 0)
      break;
    MD5Update(&ctx, buffer, i);
    n -= i;
  }
  e = errno;
  close(f);
  errno = e;
  if (i < 0)
    return 0;
  return (MD5End(&ctx, buf));
}